

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ClockingSkewSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingSkewSyntax,slang::syntax::ClockingSkewSyntax_const&>
          (BumpAllocator *this,ClockingSkewSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TimingControlSyntax *pTVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  ClockingSkewSyntax *pCVar10;
  
  pCVar10 = (ClockingSkewSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClockingSkewSyntax *)this->endPtr < pCVar10 + 1) {
    pCVar10 = (ClockingSkewSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pCVar10 + 1);
  }
  SVar8 = (args->super_SyntaxNode).kind;
  uVar9 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar4 = (args->edge).kind;
  uVar5 = (args->edge).field_0x2;
  NVar6.raw = (args->edge).numFlags.raw;
  uVar7 = (args->edge).rawLen;
  pTVar3 = args->delay;
  (pCVar10->edge).info = (args->edge).info;
  pCVar10->delay = pTVar3;
  (pCVar10->super_SyntaxNode).previewNode = pSVar2;
  (pCVar10->edge).kind = TVar4;
  (pCVar10->edge).field_0x2 = uVar5;
  (pCVar10->edge).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar10->edge).rawLen = uVar7;
  (pCVar10->super_SyntaxNode).kind = SVar8;
  *(undefined4 *)&(pCVar10->super_SyntaxNode).field_0x4 = uVar9;
  (pCVar10->super_SyntaxNode).parent = pSVar1;
  return pCVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }